

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

char * ImGui::TableGetColumnName(ImGuiTable *table,int column_n)

{
  ImGuiTableColumn *pIVar1;
  char *pcVar2;
  
  if ((table->IsLayoutLocked != false) || (column_n < table->DeclColumnsCount)) {
    pIVar1 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,column_n);
    if (pIVar1->NameOffset != -1) {
      pcVar2 = ImVector<char>::operator[](&(table->ColumnsNames).Buf,(int)pIVar1->NameOffset);
      return pcVar2;
    }
  }
  return "";
}

Assistant:

const char* ImGui::TableGetColumnName(const ImGuiTable* table, int column_n)
{
    if (table->IsLayoutLocked == false && column_n >= table->DeclColumnsCount)
        return ""; // NameOffset is invalid at this point
    const ImGuiTableColumn* column = &table->Columns[column_n];
    if (column->NameOffset == -1)
        return "";
    return &table->ColumnsNames.Buf[column->NameOffset];
}